

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O2

int runcmdopt(lua_State *L,char *opt)

{
  char *pcVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((opt != (char *)0x0) && (*opt != '\0')) {
    iVar2 = 1;
    while( true ) {
      pcVar1 = strchr(opt,0x2c);
      if (pcVar1 == (char *)0x0) break;
      if ((long)pcVar1 - (long)opt == 0) {
        lua_pushnil(L);
      }
      else {
        lua_pushlstring(L,opt,(long)pcVar1 - (long)opt);
      }
      opt = pcVar1 + 1;
      iVar2 = iVar2 + 1;
    }
    if (*opt == '\0') {
      lua_pushnil(L);
    }
    else {
      lua_pushstring(L,opt);
    }
  }
  iVar2 = lua_pcall(L,iVar2,0,0);
  iVar2 = report(L,iVar2);
  return iVar2;
}

Assistant:

static int runcmdopt(lua_State *L, const char *opt)
{
  int narg = 0;
  if (opt && *opt) {
    for (;;) {  /* Split arguments. */
      const char *p = strchr(opt, ',');
      narg++;
      if (!p) break;
      if (p == opt)
	lua_pushnil(L);
      else
	lua_pushlstring(L, opt, (size_t)(p - opt));
      opt = p + 1;
    }
    if (*opt)
      lua_pushstring(L, opt);
    else
      lua_pushnil(L);
  }
  return report(L, lua_pcall(L, narg, 0, 0));
}